

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O2

bool __thiscall
BCL::
HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
::find_nonatomic_impl_
          (HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,int *val)

{
  int iVar1;
  __type _Var2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  HME entry;
  Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_void>
  local_78;
  undefined8 uStack_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  sVar3 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&this->field_0x18,key);
  local_78.len = 0;
  local_78.ptr.rank = 0;
  local_78.ptr.ptr = 0;
  uStack_60 = (ulong)(uint)uStack_60;
  uVar4 = this->capacity_;
  uVar5 = 0;
  do {
    _Var2 = false;
    get_entry((HME *)&local_50,this,(uVar5 * uVar5 + sVar3) % uVar4);
    local_78.len = local_50.field_2._M_allocated_capacity;
    uStack_60 = local_50.field_2._8_8_;
    uVar4 = uStack_60;
    local_78.ptr.rank = (size_t)local_50._M_dataplus._M_p;
    local_78.ptr.ptr = local_50._M_string_length;
    uStack_60._4_4_ = (int)((ulong)local_50.field_2._8_8_ >> 0x20);
    iVar1 = uStack_60._4_4_;
    bVar6 = uStack_60._4_4_ == 2;
    uStack_60 = uVar4;
    if (bVar6) {
      Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_void>
      ::get(&local_50,&local_78);
      _Var2 = std::operator==(&local_50,key);
      std::__cxx11::string::~string((string *)&local_50);
    }
    if ((iVar1 == 0) || (_Var2 != false)) break;
    uVar5 = uVar5 + 1;
    uVar4 = this->capacity_;
  } while (uVar5 < uVar4);
  if (_Var2 != false) {
    *val = (uint)uStack_60;
  }
  return _Var2;
}

Assistant:

bool find_nonatomic_impl_(const Key &key, T &val) {
    size_t hash = hash_fn_(key);
    size_type probe = 0;
    bool success = false;
    HME entry;
    int status;
    do {
      size_type slot = (hash + get_probe(probe++)) % capacity();
      entry = get_entry(slot);
      status = entry.used;
      if (status == ready_flag) {
        success = (entry.get_key() == key);
      }
    } while (!success && status != free_flag && probe < capacity());
    if (success) {
      val = entry.get_val();
      return true;
    } else {
      return false;
    }
  }